

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall util_tests::util_seed_insecure_rand::test_method(util_seed_insecure_rand *this)

{
  uint uVar1;
  uint64_t uVar2;
  ulong uVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  int i;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  long in_FS_OFFSET;
  double dVar10;
  double dVar11;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  check_type cVar13;
  int iVar12;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  lazy_ostream local_90;
  undefined1 *local_80;
  char **local_78;
  assertion_result local_70;
  undefined1 *local_58;
  undefined1 *local_50;
  char *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  BasicTestingSetup::SeedRandomForTest(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,ZEROS);
  for (uVar7 = 2; uVar9 = 1, uVar7 != 0xb; uVar7 = uVar7 + 1) {
    dVar11 = (double)(int)uVar7;
    dVar10 = ((1.0 - 1.0 / dVar11) * (1.0 / dVar11)) / 10000.0;
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    dVar10 = (300000.0 / dVar11) * dVar10;
    for (; (int)uVar9 < (int)(uVar7 - 1); uVar9 = uVar9 * 2 + 1) {
    }
    iVar8 = 0;
    for (iVar6 = 0; iVar6 != 10000; iVar6 = iVar6 + 1) {
      do {
        uVar2 = RandomMixin<FastRandomContext>::randbits<32>
                          (&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng.
                            super_RandomMixin<FastRandomContext>);
        uVar1 = (uint)uVar2 & uVar9;
      } while (uVar7 <= uVar1);
      iVar8 = iVar8 + (uint)(uVar1 == 0);
    }
    uVar3 = (ulong)(uint)(int)dVar10;
    local_48 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
    local_40 = "";
    local_58 = &boost::unit_test::basic_cstring<char_const>::null;
    local_50 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x1e1;
    file.m_begin = (iterator)&local_48;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_58,msg);
    iVar6 = (int)(10000 / (ulong)uVar7);
    local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar8 <= iVar6 + (int)dVar10);
    local_70.m_message.px = (element_type *)0x0;
    local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_a0 = "count<=10000/mod+err";
    local_98 = "";
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_78 = &local_a0;
    local_b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
    local_a8 = "";
    pvVar4 = &DAT_00000001;
    pvVar5 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_70,&local_90,1,0,WARN,_cVar13,(size_t)&local_b0,0x1e1,uVar3);
    iVar12 = (int)uVar3;
    boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
    local_c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
    local_b8 = "";
    local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x1e2;
    file_00.m_begin = (iterator)&local_c0;
    msg_00.m_end = pvVar5;
    msg_00.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_d0,
               msg_00);
    local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar6 - iVar12 <= iVar8);
    local_70.m_message.px = (element_type *)0x0;
    local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_a0 = "count>=10000/mod-err";
    local_98 = "";
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_78 = &local_a0;
    local_e0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
    local_d8 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_70,&local_90,1,0,WARN,_cVar13,(size_t)&local_e0,0x1e2);
    boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_seed_insecure_rand)
{
    SeedRandomForTest(SeedRand::ZEROS);
    for (int mod=2;mod<11;mod++)
    {
        int mask = 1;
        // Really rough binomial confidence approximation.
        int err = 30*10000./mod*sqrt((1./mod*(1-1./mod))/10000.);
        //mask is 2^ceil(log2(mod))-1
        while(mask<mod-1)mask=(mask<<1)+1;

        int count = 0;
        //How often does it get a zero from the uniform range [0,mod)?
        for (int i = 0; i < 10000; i++) {
            uint32_t rval;
            do{
                rval=m_rng.rand32()&mask;
            }while(rval>=(uint32_t)mod);
            count += rval==0;
        }
        BOOST_CHECK(count<=10000/mod+err);
        BOOST_CHECK(count>=10000/mod-err);
    }
}